

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DRunningScript::Serialize(DRunningScript *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DRunningScript *this_local;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = FSerializer::operator()(arc,"script",&this->script);
  pFVar1 = FSerializer::operator()(pFVar1,"save_point",&this->save_point);
  pFVar1 = FSerializer::operator()(pFVar1,"wait_type",&this->wait_type);
  pFVar1 = FSerializer::operator()(pFVar1,"wait_data",&this->wait_data);
  pFVar1 = FSerializer::operator()(pFVar1,"prev",&this->prev);
  pFVar1 = FSerializer::operator()(pFVar1,"next",&this->next);
  pFVar1 = FSerializer::operator()(pFVar1,"trigger",&this->trigger);
  FSerializer::Array<TObjPtr<DFsVariable>>(pFVar1,"variables",this->variables,0x10,false);
  return;
}

Assistant:

void DRunningScript::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("script", script)
		("save_point", save_point)
		("wait_type", wait_type)
		("wait_data", wait_data)
		("prev", prev)
		("next", next)
		("trigger", trigger)
		.Array("variables", variables, VARIABLESLOTS);
}